

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item::hide_widgets(Fl_Tree_Item *this)

{
  int iVar1;
  Fl_Tree_Item *this_00;
  int local_14;
  int t;
  Fl_Tree_Item *this_local;
  
  if (this->_widget != (Fl_Widget *)0x0) {
    (*this->_widget->_vptr_Fl_Widget[6])();
  }
  local_14 = 0;
  while( true ) {
    iVar1 = Fl_Tree_Item_Array::total(&this->_children);
    if (iVar1 <= local_14) break;
    this_00 = Fl_Tree_Item_Array::operator[](&this->_children,local_14);
    hide_widgets(this_00);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Fl_Tree_Item::hide_widgets() {
  if ( _widget ) _widget->hide();
  for ( int t=0; t<_children.total(); t++ ) {
    _children[t]->hide_widgets();
  }
}